

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command-bind.h
# Opt level: O0

CommandVoid3<dynamicgraph::CustomEntity,_int,_int,_int> * __thiscall
dynamicgraph::command::CommandVoid3<dynamicgraph::CustomEntity,_int,_int,_int>::doExecute
          (CommandVoid3<dynamicgraph::CustomEntity,_int,_int,_int> *this)

{
  int iVar1;
  vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_> *pvVar2;
  size_type sVar3;
  long in_RSI;
  EitherType local_50 [12];
  int local_44;
  EitherType local_40 [4];
  int val3;
  int local_38 [2];
  int val2;
  EitherType local_28 [12];
  int local_1c [2];
  int val1;
  CommandVoid3<dynamicgraph::CustomEntity,_int,_int,_int> *this_local;
  
  this_local = this;
  pvVar2 = (vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_> *)
           dynamicgraph::command::Command::getParameterValues();
  sVar3 = std::vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>::
          size(pvVar2);
  if (sVar3 == 3) {
    pvVar2 = (vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_> *)
             dynamicgraph::command::Command::getParameterValues();
    std::vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>::
    operator[](pvVar2,0);
    dynamicgraph::command::Value::value();
    iVar1 = dynamicgraph::command::EitherType::operator_cast_to_int(local_28);
    dynamicgraph::command::EitherType::~EitherType(local_28);
    local_1c[0] = iVar1;
    pvVar2 = (vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_> *)
             dynamicgraph::command::Command::getParameterValues();
    std::vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>::
    operator[](pvVar2,1);
    dynamicgraph::command::Value::value();
    iVar1 = dynamicgraph::command::EitherType::operator_cast_to_int(local_40);
    dynamicgraph::command::EitherType::~EitherType(local_40);
    local_38[0] = iVar1;
    pvVar2 = (vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_> *)
             dynamicgraph::command::Command::getParameterValues();
    std::vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>::
    operator[](pvVar2,2);
    dynamicgraph::command::Value::value();
    iVar1 = dynamicgraph::command::EitherType::operator_cast_to_int(local_50);
    dynamicgraph::command::EitherType::~EitherType(local_50);
    local_44 = iVar1;
    boost::function3<void,_const_int_&,_const_int_&,_const_int_&>::operator()
              ((function3<void,_const_int_&,_const_int_&,_const_int_&> *)(in_RSI + 0x60),local_1c,
               local_38,&local_44);
    dynamicgraph::command::Value::Value((Value *)this);
    return this;
  }
  __assert_fail("getParameterValues().size() == 3",
                "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/include/dynamic-graph/command-bind.h"
                ,0xdd,
                "virtual Value dynamicgraph::command::CommandVoid3<dynamicgraph::CustomEntity, int, int, int>::doExecute() [E = dynamicgraph::CustomEntity, T1 = int, T2 = int, T3 = int]"
               );
}

Assistant:

virtual Value doExecute() {
    assert(getParameterValues().size() == 3);
    T1 val1 = getParameterValues()[0].value();
    T2 val2 = getParameterValues()[1].value();
    T3 val3 = getParameterValues()[2].value();
    fptr(val1, val2, val3);
    return Value();  // void
  }